

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwindow.cpp
# Opt level: O3

void __thiscall QOpenGLWindow::~QOpenGLWindow(QOpenGLWindow *this)

{
  long lVar1;
  long *plVar2;
  char cVar3;
  
  *(undefined ***)this = &PTR_metaObject_001a1790;
  *(undefined ***)&this->field_0x10 = &PTR__QOpenGLWindow_001a1908;
  *(undefined ***)&this->field_0x28 = &PTR__QOpenGLWindow_001a1948;
  lVar1 = *(long *)&this->field_0x8;
  makeCurrent(this);
  if (*(long *)(*(long *)&this->field_0x8 + 400) != 0) {
    cVar3 = QOpenGLContext::isValid();
    if (cVar3 != '\0') {
      plVar2 = *(long **)(lVar1 + 0x1a8);
      if (plVar2 != (long *)0x0) {
        *(undefined8 *)(lVar1 + 0x1a8) = 0;
        (**(code **)(*plVar2 + 8))();
      }
      plVar2 = *(long **)(lVar1 + 0x1a0);
      if (plVar2 != (long *)0x0) {
        *(undefined8 *)(lVar1 + 0x1a0) = 0;
        (**(code **)(*plVar2 + 8))();
      }
      QOpenGLTextureBlitter::destroy((QOpenGLTextureBlitter *)(lVar1 + 0x1b0));
    }
  }
  doneCurrent(this);
  QPaintDevice::~QPaintDevice((QPaintDevice *)&this->field_0x28);
  QWindow::~QWindow((QWindow *)this);
  return;
}

Assistant:

QOpenGLWindow::~QOpenGLWindow()
{
    Q_D(QOpenGLWindow);

    makeCurrent(); // this works even when the platformwindow is destroyed
    if (isValid()) {
        d->paintDevice.reset(nullptr);
        d->fbo.reset(nullptr);
        d->blitter.destroy();
    }
    doneCurrent();
}